

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotTesting.c
# Opt level: O0

void printGuardList(UnitList *guardList)

{
  int local_24;
  char *pcStack_20;
  int i;
  Guard *guard;
  UnitNode *nextNode;
  UnitList *guardList_local;
  
  guard = (Guard *)getHead(guardList);
  pcStack_20 = *(char **)guard;
  printf("\nGuard List Size: %d\n",(ulong)(uint)guardList->count);
  printf("\n\n#### PRINTING GUARDS ####\n\n");
  for (local_24 = 0; local_24 < guardList->count + -1; local_24 = local_24 + 1) {
    printf("Guard Type : %c\n",(ulong)(uint)(int)*pcStack_20);
    printf("Location: %d\n",(ulong)*(uint *)(pcStack_20 + 4));
    printf("Damage: %d\n",(ulong)*(uint *)(pcStack_20 + 8));
    printf("Range: %d\n",(ulong)*(uint *)(pcStack_20 + 0xc));
    printf("Cool Down: %d\n",(ulong)*(uint *)(pcStack_20 + 0x10));
    printf("\n");
    guard = *(Guard **)&guard->damage;
    pcStack_20 = *(char **)guard;
  }
  printf("\n########################\n");
  return;
}

Assistant:

void printGuardList(struct UnitList *guardList) {
    struct UnitNode *nextNode;
    struct Guard *guard;

    nextNode = getHead(guardList);
    guard = (struct Guard *) nextNode->unit;
    printf("\nGuard List Size: %d\n", guardList->count);
    printf("\n\n#### PRINTING GUARDS ####\n\n");
    for (int i = 0; i < guardList->count - 1; i++) {
        printf("Guard Type : %c\n", guard->type);
        printf("Location: %d\n", guard->position);
        printf("Damage: %d\n", guard->damage);
        printf("Range: %d\n", guard->range);
        printf("Cool Down: %d\n", guard->cooldown);
        printf("\n");
        nextNode = nextNode->next;
        guard = (struct Guard *) nextNode->unit;
    }
    printf("\n########################\n");
}